

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

Edge __thiscall
geometrycentral::surface::SurfaceMesh::separateToNewEdge
          (SurfaceMesh *this,Halfedge heA,Halfedge heB)

{
  pointer puVar1;
  size_t sVar2;
  runtime_error *this_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar7;
  unsigned_long uVar8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> EVar9;
  Edge e;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator> __begin2;
  unsigned_long uVar6;
  
  uVar7 = heB.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind;
  uVar4 = heA.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind;
  e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
       heA.super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
       mesh;
  if (this->useImplicitTwinFlag == true) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,
               "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh."
              );
  }
  else {
    if ((e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh
        )->useImplicitTwinFlag == true) {
      uVar3 = uVar4 >> 1;
    }
    else {
      uVar3 = ((e.
                super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4];
    }
    if ((heB.
         super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
        mesh)->useImplicitTwinFlag == true) {
      uVar5 = uVar7 >> 1;
    }
    else {
      uVar5 = ((heB.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
               .mesh)->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar7];
    }
    if (uVar3 == uVar5) {
      if (uVar4 != uVar7) {
        if ((e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
            mesh)->useImplicitTwinFlag == false) {
          e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
               = ((e.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                  .mesh)->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
        }
        else {
          e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind
               = uVar4 >> 1;
        }
        sVar2 = Edge::degree(&e);
        EVar9.ind = e.
                    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                    .ind;
        EVar9.mesh = e.
                     super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .mesh;
        if (2 < sVar2) {
          EVar9 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
                  getNewEdge(this);
          uVar6 = EVar9.ind;
          if ((e.
               super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
              mesh)->useImplicitTwinFlag == true) {
            uVar8 = e.
                    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                    .ind * 2;
          }
          else {
            uVar8 = ((e.
                      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .mesh)->eHalfedgeArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [e.
                     super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                     .ind];
          }
          __begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = e.
                 super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                 .mesh;
          __begin2.justStarted = true;
          __begin2.state.currE.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = uVar8;
          while( true ) {
            if ((__begin2.justStarted == false) &&
               (__begin2.state.currE.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind == uVar8)) goto LAB_00159856;
            if (__begin2.state.currE.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind != uVar7 &&
                __begin2.state.currE.
                super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                .ind != uVar4) break;
            NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentHalfedgeNavigator>::
            operator++(&__begin2);
          }
          (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start
          [e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.
           ind] = __begin2.state.currE.
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  .ind;
LAB_00159856:
          removeFromSiblingList(this,heA);
          removeFromSiblingList(this,heB);
          (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar6] = uVar4;
          puVar1 = (this->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1[uVar4] = uVar6;
          puVar1[uVar7] = uVar6;
          puVar1 = (this->heSiblingArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar1[uVar4] = uVar7;
          puVar1[uVar7] = uVar4;
          this->modificationTick = this->modificationTick + 1;
        }
        return (Edge)EVar9;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be distinct");
    }
    else {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(this_00,"halfedges must be incident on same edge");
    }
  }
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Edge SurfaceMesh::separateToNewEdge(Halfedge heA, Halfedge heB) {
  if (usesImplicitTwin())
    throw std::runtime_error(
        "Cannot separate edge from manifold mesh; all are already manifold. Try general SurfaceMesh.");

  if (heA.edge() != heB.edge()) throw std::runtime_error("halfedges must be incident on same edge");
  if (heA == heB) throw std::runtime_error("halfedges must be distinct");

  // If theres <= 2 halfedges incident on the edge, we don't have any work to do.
  Edge e = heA.edge();
  if (e.degree() <= 2) return e;

  Edge newE = getNewEdge();

  // find some other halfedge incident on the old edge, make it e.halfedge()
  for (Halfedge he : e.adjacentHalfedges()) {
    if (he != heA && he != heB) {
      eHalfedgeArr[e.getIndex()] = he.getIndex();
      break;
    }
  }

  removeFromSiblingList(heA);
  removeFromSiblingList(heB);

  eHalfedgeArr[newE.getIndex()] = heA.getIndex();
  heEdgeArr[heA.getIndex()] = newE.getIndex();
  heEdgeArr[heB.getIndex()] = newE.getIndex();
  heSiblingArr[heA.getIndex()] = heB.getIndex();
  heSiblingArr[heB.getIndex()] = heA.getIndex();


  modificationTick++;
  return newE;
}